

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::rewrite_load_for_wrapped_row_major
          (CompilerGLSL *this,string *expr,TypeID loaded_type,ID ptr)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  size_t sVar4;
  bool local_c1;
  spirv_cross local_b8 [32];
  uint32_t local_98;
  Bitset local_88;
  uint local_48;
  byte local_41;
  uint32_t i;
  bool rewrite;
  SPIRType *type;
  SPIRType *pSStack_30;
  bool is_ubo;
  SPIRType *backing_type;
  SPIRVariable *var;
  string *expr_local;
  CompilerGLSL *this_local;
  ID ptr_local;
  TypeID loaded_type_local;
  
  var = (SPIRVariable *)expr;
  expr_local = (string *)this;
  this_local._0_4_ = ptr.id;
  this_local._4_4_ = loaded_type.id;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this_local);
  backing_type = (SPIRType *)Compiler::maybe_get_backing_variable(&this->super_Compiler,uVar3);
  if (backing_type != (SPIRType *)0x0) {
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(backing_type->super_IVariant).field_0xc);
    pSStack_30 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
    local_c1 = false;
    if ((*(int *)&(pSStack_30->super_IVariant).field_0xc == 0xf) &&
       (local_c1 = false, pSStack_30->storage == StorageClassUniform)) {
      type._0_4_ = (pSStack_30->super_IVariant).self.id;
      local_c1 = Compiler::has_decoration(&this->super_Compiler,type._0_4_,DecorationBlock);
    }
    type._7_1_ = local_c1;
    if (local_c1 != false) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
      _i = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
      local_41 = 0;
      bVar2 = Compiler::is_matrix(&this->super_Compiler,_i);
      if (bVar2) {
        _i = pSStack_30;
      }
      if (*(int *)&(_i->super_IVariant).field_0xc == 0xf) {
        for (local_48 = 0; uVar1 = local_48,
            sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                              (&(_i->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>),
            uVar1 < (uint)sVar4; local_48 = local_48 + 1) {
          Compiler::combined_decoration_for_member(&local_88,&this->super_Compiler,_i,local_48);
          bVar2 = Bitset::get(&local_88,4);
          Bitset::~Bitset(&local_88);
          if (bVar2) {
            local_41 = 1;
            break;
          }
        }
      }
      if ((local_41 & 1) != 0) {
        local_98 = this_local._4_4_;
        request_workaround_wrapper_overload(this,this_local._4_4_);
        join<char_const(&)[23],std::__cxx11::string&,char_const(&)[2]>
                  (local_b8,(char (*) [23])0x5b09f2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)var,
                   (char (*) [2])0x5b48c4);
        ::std::__cxx11::string::operator=((string *)var,(string *)local_b8);
        ::std::__cxx11::string::~string((string *)local_b8);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::rewrite_load_for_wrapped_row_major(std::string &expr, TypeID loaded_type, ID ptr)
{
	// Loading row-major matrices from UBOs on older AMD Windows OpenGL drivers is problematic.
	// To load these types correctly, we must first wrap them in a dummy function which only purpose is to
	// ensure row_major decoration is actually respected.
	auto *var = maybe_get_backing_variable(ptr);
	if (!var)
		return;

	auto &backing_type = get<SPIRType>(var->basetype);
	bool is_ubo = backing_type.basetype == SPIRType::Struct && backing_type.storage == StorageClassUniform &&
	              has_decoration(backing_type.self, DecorationBlock);
	if (!is_ubo)
		return;

	auto *type = &get<SPIRType>(loaded_type);
	bool rewrite = false;

	if (is_matrix(*type))
	{
		// To avoid adding a lot of unnecessary meta tracking to forward the row_major state,
		// we will simply look at the base struct itself. It is exceptionally rare to mix and match row-major/col-major state.
		// If there is any row-major action going on, we apply the workaround.
		// It is harmless to apply the workaround to column-major matrices, so this is still a valid solution.
		// If an access chain occurred, the workaround is not required, so loading vectors or scalars don't need workaround.
		type = &backing_type;
	}

	if (type->basetype == SPIRType::Struct)
	{
		// If we're loading a struct where any member is a row-major matrix, apply the workaround.
		for (uint32_t i = 0; i < uint32_t(type->member_types.size()); i++)
		{
			if (combined_decoration_for_member(*type, i).get(DecorationRowMajor))
			{
				rewrite = true;
				break;
			}
		}
	}

	if (rewrite)
	{
		request_workaround_wrapper_overload(loaded_type);
		expr = join("spvWorkaroundRowMajor(", expr, ")");
	}
}